

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.cpp
# Opt level: O0

int __thiscall ncnn::Power::forward_inplace(Power *this,Mat *bottom_top_blob,Option *opt)

{
  long in_RSI;
  Mat *in_RDI;
  double dVar1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float *in_stack_ffffffffffffff70;
  int local_80;
  Mat local_70;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = *(int *)(in_RSI + 0x28);
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    Mat::channel(in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    in_stack_ffffffffffffff70 = Mat::operator_cast_to_float_(&local_70);
    Mat::~Mat((Mat *)0x122180);
    local_38 = in_stack_ffffffffffffff70;
    for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
      dVar1 = std::pow((double)(ulong)(uint)(*(float *)&in_RDI[2].allocator +
                                            local_38[local_80] *
                                            *(float *)((long)&in_RDI[2].elemsize + 4)),
                       (double)(ulong)(uint)in_RDI[2].elemsize);
      local_38[local_80] = SUB84(dVar1,0);
    }
  }
  return 0;
}

Assistant:

int Power::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = pow((shift + ptr[i] * scale), power);
        }
    }

    return 0;
}